

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O0

bool duckdb_fast_float::fastfloat_strncasecmp(char *input1,char *input2,size_t length)

{
  bool local_29;
  size_t i;
  char running_diff;
  size_t length_local;
  char *input2_local;
  char *input1_local;
  
  running_diff = '\0';
  for (i = 0; i < length; i = i + 1) {
    running_diff = running_diff | input1[i] ^ input2[i];
  }
  local_29 = running_diff == '\0' || running_diff == ' ';
  return local_29;
}

Assistant:

inline bool fastfloat_strncasecmp(const char *input1, const char *input2,
                                  size_t length) {
  char running_diff{0};
  for (size_t i = 0; i < length; i++) {
    running_diff |= (input1[i] ^ input2[i]);
  }
  return (running_diff == 0) || (running_diff == 32);
}